

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAddqEa<(moira::Instr)121,(moira::Mode)6,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 addr;
  u32 uVar1;
  undefined8 in_RAX;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  addr = computeEA<(moira::Mode)6,(moira::Size)2,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)2,128ul>(this,addr,&local_21);
  if (local_21 == false) {
    bVar3 = 8;
    if ((opcode & 0xe00) != 0) {
      bVar3 = (byte)(opcode >> 9) & 7;
    }
    uVar4 = (ulong)uVar1 - (ulong)bVar3;
    bVar2 = (bool)((byte)(uVar4 >> 0x10) & 1);
    (this->reg).sr.c = bVar2;
    (this->reg).sr.x = bVar2;
    (this->reg).sr.v = (bool)((byte)((((uint)uVar4 ^ uVar1) & uVar1) >> 0xf) & 1);
    (this->reg).sr.z = (short)uVar4 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar4 >> 0xf) & 1);
    uVar1 = (this->reg).pc;
    (this->reg).pc0 = uVar1;
    (this->queue).ird = (this->queue).irc;
    uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar1 + 2);
    (this->queue).irc = (u16)uVar1;
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,addr,(uint)uVar4);
  }
  return;
}

Assistant:

void
Moira::execAddqEa(u16 opcode)
{
    i8  src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    if (src == 0) src = 8;
    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}